

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HL1MDLLoader.cpp
# Opt level: O1

void __thiscall Assimp::MDL::HalfLife::HL1MDLLoader::read_sequence_infos(HL1MDLLoader *this)

{
  pointer *pppaVar1;
  char *pcVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  int iVar6;
  uint uVar7;
  Header_HL1 *pHVar8;
  iterator __position;
  pointer pbVar9;
  uint __val;
  undefined8 uVar10;
  size_type sVar11;
  uint uVar12;
  bool bVar13;
  uint uVar14;
  aiNode *paVar15;
  aiNode **ppaVar16;
  aiMetadata *paVar17;
  aiString *paVar18;
  aiMetadataEntry *paVar19;
  int *piVar20;
  undefined4 *puVar21;
  uint *puVar22;
  long *plVar23;
  Logger *this_00;
  undefined8 *puVar24;
  int32_t *piVar25;
  size_type *psVar26;
  ulong *puVar27;
  long *plVar28;
  uint __len;
  ulong uVar29;
  size_t sVar30;
  ulong uVar31;
  aiString **ppaVar32;
  char *pcVar33;
  long lVar34;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar35;
  aiNode *blend_controllers_node;
  int num_blend_controllers;
  vector<aiNode_*,_std::allocator<aiNode_*>_> sequence_info_node_children;
  aiNode *sequence_infos_node;
  aiNode *pEventsNode;
  string __str;
  char *local_610;
  aiNode *local_5f8;
  ulong local_5f0;
  undefined1 local_5e8 [24];
  int local_5d0;
  allocator<char> local_5c9;
  ulong *local_5c8;
  ulong local_5c0;
  ulong local_5b8;
  long lStack_5b0;
  aiNode **local_5a8;
  iterator iStack_5a0;
  aiNode **local_598;
  aiNode *local_590;
  aiNode *local_588;
  aiNode *local_580;
  long local_578;
  undefined1 local_570 [16];
  ulong *local_560;
  long local_558;
  ulong local_550 [2];
  ulong *local_540;
  long local_538;
  ulong local_530 [2];
  ulong *local_520;
  long local_518;
  ulong local_510;
  long lStack_508;
  long *local_500;
  char local_4f8 [8];
  long local_4f0;
  char acStack_4e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  long *local_4c0 [2];
  long local_4b0 [2];
  long *local_4a0;
  long local_498;
  long local_490;
  long lStack_488;
  long local_480;
  long *local_478 [2];
  long local_468 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  string local_438 [32];
  
  pHVar8 = this->header_;
  if (pHVar8->numseq != 0) {
    iVar6 = pHVar8->seqindex;
    local_5e8._16_8_ = this;
    paVar15 = (aiNode *)operator_new(0x478);
    local_438[0]._M_dataplus._M_p = (pointer)&local_438[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"<MDL_sequence_infos>","");
    aiNode::aiNode(paVar15,local_438);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438[0]._M_dataplus._M_p != &local_438[0].field_2) {
      operator_delete(local_438[0]._M_dataplus._M_p,local_438[0].field_2._M_allocated_capacity + 1);
    }
    uVar10 = local_5e8._16_8_;
    __position._M_current =
         (((vector<aiNode_*,_std::allocator<aiNode_*>_> *)(local_5e8._16_8_ + 0x58))->
         super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    local_588 = paVar15;
    if (__position._M_current ==
        (((vector<aiNode_*,_std::allocator<aiNode_*>_> *)(local_5e8._16_8_ + 0x58))->
        super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<aiNode*,std::allocator<aiNode*>>::_M_realloc_insert<aiNode*const&>
                ((vector<aiNode*,std::allocator<aiNode*>> *)(local_5e8._16_8_ + 0x58),__position,
                 &local_588);
    }
    else {
      *__position._M_current = paVar15;
      pppaVar1 = &(((vector<aiNode_*,_std::allocator<aiNode_*>_> *)(local_5e8._16_8_ + 0x58))->
                  super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppaVar1 = *pppaVar1 + 1;
    }
    paVar15 = local_588;
    uVar7 = (*(Header_HL1 **)(uVar10 + 0x28))->numseq;
    local_588->mNumChildren = uVar7;
    ppaVar16 = (aiNode **)operator_new__((ulong)uVar7 << 3);
    paVar15->mChildren = ppaVar16;
    local_5a8 = (aiNode **)0x0;
    iStack_5a0._M_current = (aiNode **)0x0;
    local_598 = (aiNode **)0x0;
    if (0 < (*(Header_HL1 **)(uVar10 + 0x28))->numseq) {
      local_610 = (pHVar8->super_HalfLifeMDLBaseHeader).ident + iVar6;
      lVar34 = 0;
      local_5d0 = 0;
      do {
        paVar35 = &local_438[0].field_2;
        if (iStack_5a0._M_current != local_5a8) {
          iStack_5a0._M_current = local_5a8;
        }
        paVar15 = (aiNode *)operator_new(0x478);
        aiNode::aiNode(paVar15,(((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)(local_5e8._16_8_ + 0xb0))->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start + lVar34);
        local_588->mChildren[lVar34] = paVar15;
        paVar15->mParent = local_588;
        local_590 = paVar15;
        local_480 = lVar34;
        paVar17 = (aiMetadata *)operator_new(0x18);
        paVar17->mKeys = (aiString *)0x0;
        paVar17->mValues = (aiMetadataEntry *)0x0;
        paVar17->mNumProperties = 0x10;
        paVar18 = (aiString *)operator_new__(0x4040);
        ppaVar32 = &paVar17->mKeys;
        lVar34 = 5;
        do {
          pcVar33 = paVar18->data + lVar34 + -9;
          pcVar33[0] = '\0';
          pcVar33[1] = '\0';
          pcVar33[2] = '\0';
          pcVar33[3] = '\0';
          paVar18->data[lVar34 + -5] = '\0';
          memset(paVar18->data + lVar34 + -4,0x1b,0x3ff);
          lVar34 = lVar34 + 0x404;
        } while (lVar34 != 0x4045);
        paVar17->mKeys = paVar18;
        uVar29 = (ulong)paVar17->mNumProperties << 4;
        paVar19 = (aiMetadataEntry *)operator_new__(uVar29);
        memset(paVar19,0,uVar29);
        paVar17->mValues = paVar19;
        local_590->mMetaData = paVar17;
        local_438[0]._M_dataplus._M_p = (pointer)paVar35;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"AnimationIndex","");
        sVar11 = local_438[0]._M_string_length;
        if ((paVar17->mNumProperties != 0) && (local_438[0]._M_string_length != 0)) {
          if (local_438[0]._M_string_length < 0x400) {
            paVar18 = *ppaVar32;
            paVar18->length = (ai_uint32)local_438[0]._M_string_length;
            memcpy(paVar18->data,local_438[0]._M_dataplus._M_p,local_438[0]._M_string_length);
            paVar18->data[sVar11] = '\0';
          }
          paVar17->mValues->mType = AI_INT32;
          piVar20 = (int *)operator_new(4);
          *piVar20 = local_5d0;
          paVar17->mValues->mData = piVar20;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438[0]._M_dataplus._M_p != paVar35) {
          operator_delete(local_438[0]._M_dataplus._M_p,
                          local_438[0].field_2._M_allocated_capacity + 1);
        }
        local_5d0 = local_5d0 + *(int *)(local_610 + 0x78);
        local_5f8 = (aiNode *)local_5e8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f8,"SequenceGroup","");
        pbVar9 = (((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(local_5e8._16_8_ + 200))->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar29 = pbVar9[*(int *)(local_610 + 0x9c)]._M_string_length;
        sVar30 = uVar29 & 0xffffffff;
        if ((uVar29 & 0xfffffc00) != 0) {
          sVar30 = 0x3ff;
        }
        local_438[0]._M_dataplus._M_p._0_4_ = (uint)sVar30;
        memcpy((void *)((long)&local_438[0]._M_dataplus._M_p + 4),
               pbVar9[*(int *)(local_610 + 0x9c)]._M_dataplus._M_p,sVar30);
        uVar29 = local_5f0;
        *(undefined1 *)((long)&local_438[0]._M_dataplus._M_p + sVar30 + 4) = 0;
        if ((1 < paVar17->mNumProperties) && (local_5f0 != 0)) {
          if (local_5f0 < 0x400) {
            paVar18 = *ppaVar32;
            paVar18[1].length = (ai_uint32)local_5f0;
            memcpy(paVar18[1].data,local_5f8,local_5f0);
            paVar18[1].data[uVar29] = '\0';
          }
          paVar17->mValues[1].mType = AI_AISTRING;
          puVar21 = (undefined4 *)operator_new(0x404);
          if (0x3fe < (uint)sVar30) {
            sVar30 = 0x3ff;
          }
          *puVar21 = (int)sVar30;
          memcpy(puVar21 + 1,(void *)((long)&local_438[0]._M_dataplus._M_p + 4),sVar30);
          *(undefined1 *)((long)puVar21 + sVar30 + 4) = 0;
          paVar17->mValues[1].mData = puVar21;
        }
        if (local_5f8 != (aiNode *)local_5e8) {
          operator_delete(local_5f8,local_5e8._0_8_ + 1);
        }
        local_438[0]._M_dataplus._M_p = (pointer)paVar35;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"FramesPerSecond","");
        sVar11 = local_438[0]._M_string_length;
        if ((2 < paVar17->mNumProperties) && (local_438[0]._M_string_length != 0)) {
          if (local_438[0]._M_string_length < 0x400) {
            paVar18 = *ppaVar32;
            paVar18[2].length = (ai_uint32)local_438[0]._M_string_length;
            memcpy(paVar18[2].data,local_438[0]._M_dataplus._M_p,local_438[0]._M_string_length);
            paVar18[2].data[sVar11] = '\0';
          }
          paVar17->mValues[2].mType = AI_FLOAT;
          puVar21 = (undefined4 *)operator_new(4);
          *puVar21 = *(undefined4 *)(local_610 + 0x20);
          paVar17->mValues[2].mData = puVar21;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438[0]._M_dataplus._M_p != paVar35) {
          operator_delete(local_438[0]._M_dataplus._M_p,
                          local_438[0].field_2._M_allocated_capacity + 1);
        }
        local_438[0]._M_dataplus._M_p = (pointer)paVar35;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"NumFrames","");
        sVar11 = local_438[0]._M_string_length;
        if ((3 < paVar17->mNumProperties) && (local_438[0]._M_string_length != 0)) {
          if (local_438[0]._M_string_length < 0x400) {
            paVar18 = *ppaVar32;
            paVar18[3].length = (ai_uint32)local_438[0]._M_string_length;
            memcpy(paVar18[3].data,local_438[0]._M_dataplus._M_p,local_438[0]._M_string_length);
            paVar18[3].data[sVar11] = '\0';
          }
          paVar17->mValues[3].mType = AI_INT32;
          puVar21 = (undefined4 *)operator_new(4);
          *puVar21 = *(undefined4 *)(local_610 + 0x38);
          paVar17->mValues[3].mData = puVar21;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438[0]._M_dataplus._M_p != paVar35) {
          operator_delete(local_438[0]._M_dataplus._M_p,
                          local_438[0].field_2._M_allocated_capacity + 1);
        }
        local_438[0]._M_dataplus._M_p = (pointer)paVar35;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"NumBlends","");
        sVar11 = local_438[0]._M_string_length;
        if ((4 < paVar17->mNumProperties) && (local_438[0]._M_string_length != 0)) {
          if (local_438[0]._M_string_length < 0x400) {
            paVar18 = *ppaVar32;
            paVar18[4].length = (ai_uint32)local_438[0]._M_string_length;
            memcpy(paVar18[4].data,local_438[0]._M_dataplus._M_p,local_438[0]._M_string_length);
            paVar18[4].data[sVar11] = '\0';
          }
          paVar17->mValues[4].mType = AI_INT32;
          puVar21 = (undefined4 *)operator_new(4);
          *puVar21 = *(undefined4 *)(local_610 + 0x78);
          paVar17->mValues[4].mData = puVar21;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438[0]._M_dataplus._M_p != paVar35) {
          operator_delete(local_438[0]._M_dataplus._M_p,
                          local_438[0].field_2._M_allocated_capacity + 1);
        }
        local_438[0]._M_dataplus._M_p = (pointer)paVar35;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"Activity","");
        sVar11 = local_438[0]._M_string_length;
        if ((5 < paVar17->mNumProperties) && (local_438[0]._M_string_length != 0)) {
          if (local_438[0]._M_string_length < 0x400) {
            paVar18 = *ppaVar32;
            paVar18[5].length = (ai_uint32)local_438[0]._M_string_length;
            memcpy(paVar18[5].data,local_438[0]._M_dataplus._M_p,local_438[0]._M_string_length);
            paVar18[5].data[sVar11] = '\0';
          }
          paVar17->mValues[5].mType = AI_INT32;
          puVar21 = (undefined4 *)operator_new(4);
          *puVar21 = *(undefined4 *)(local_610 + 0x28);
          paVar17->mValues[5].mData = puVar21;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438[0]._M_dataplus._M_p != paVar35) {
          operator_delete(local_438[0]._M_dataplus._M_p,
                          local_438[0].field_2._M_allocated_capacity + 1);
        }
        local_438[0]._M_dataplus._M_p = (pointer)paVar35;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"ActivityWeight","");
        sVar11 = local_438[0]._M_string_length;
        if ((6 < paVar17->mNumProperties) && (local_438[0]._M_string_length != 0)) {
          if (local_438[0]._M_string_length < 0x400) {
            paVar18 = *ppaVar32;
            paVar18[6].length = (ai_uint32)local_438[0]._M_string_length;
            memcpy(paVar18[6].data,local_438[0]._M_dataplus._M_p,local_438[0]._M_string_length);
            paVar18[6].data[sVar11] = '\0';
          }
          paVar17->mValues[6].mType = AI_INT32;
          puVar21 = (undefined4 *)operator_new(4);
          *puVar21 = *(undefined4 *)(local_610 + 0x2c);
          paVar17->mValues[6].mData = puVar21;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438[0]._M_dataplus._M_p != paVar35) {
          operator_delete(local_438[0]._M_dataplus._M_p,
                          local_438[0].field_2._M_allocated_capacity + 1);
        }
        local_438[0]._M_dataplus._M_p = (pointer)paVar35;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"MotionFlags","");
        sVar11 = local_438[0]._M_string_length;
        if ((7 < paVar17->mNumProperties) && (local_438[0]._M_string_length != 0)) {
          if (local_438[0]._M_string_length < 0x400) {
            paVar18 = *ppaVar32;
            paVar18[7].length = (ai_uint32)local_438[0]._M_string_length;
            memcpy(paVar18[7].data,local_438[0]._M_dataplus._M_p,local_438[0]._M_string_length);
            paVar18[7].data[sVar11] = '\0';
          }
          paVar17->mValues[7].mType = AI_INT32;
          puVar21 = (undefined4 *)operator_new(4);
          *puVar21 = *(undefined4 *)(local_610 + 0x44);
          paVar17->mValues[7].mData = puVar21;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438[0]._M_dataplus._M_p != paVar35) {
          operator_delete(local_438[0]._M_dataplus._M_p,
                          local_438[0].field_2._M_allocated_capacity + 1);
        }
        local_438[0]._M_dataplus._M_p = (pointer)paVar35;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"MotionBone","");
        sVar11 = local_438[0]._M_string_length;
        if ((8 < paVar17->mNumProperties) && (local_438[0]._M_string_length != 0)) {
          paVar15 = (((vector<Assimp::MDL::HalfLife::HL1MDLLoader::TempBone,_std::allocator<Assimp::MDL::HalfLife::HL1MDLLoader::TempBone>_>
                       *)(local_5e8._16_8_ + 0xe0))->
                    super__Vector_base<Assimp::MDL::HalfLife::HL1MDLLoader::TempBone,_std::allocator<Assimp::MDL::HalfLife::HL1MDLLoader::TempBone>_>
                    )._M_impl.super__Vector_impl_data._M_start[*(int *)(local_610 + 0x48)].node;
          if (local_438[0]._M_string_length < 0x400) {
            paVar18 = *ppaVar32;
            paVar18[8].length = (ai_uint32)local_438[0]._M_string_length;
            memcpy(paVar18[8].data,local_438[0]._M_dataplus._M_p,local_438[0]._M_string_length);
            paVar18[8].data[sVar11] = '\0';
          }
          paVar17->mValues[8].mType = AI_AISTRING;
          puVar22 = (uint *)operator_new(0x404);
          uVar7 = (paVar15->mName).length;
          if (0x3fe < uVar7) {
            uVar7 = 0x3ff;
          }
          *puVar22 = uVar7;
          memcpy(puVar22 + 1,(paVar15->mName).data,(ulong)uVar7);
          *(undefined1 *)((long)puVar22 + (ulong)uVar7 + 4) = 0;
          paVar17->mValues[8].mData = puVar22;
        }
        paVar35 = &local_438[0].field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438[0]._M_dataplus._M_p != paVar35) {
          operator_delete(local_438[0]._M_dataplus._M_p,
                          local_438[0].field_2._M_allocated_capacity + 1);
        }
        local_438[0]._M_dataplus._M_p = (pointer)paVar35;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"LinearMovement","");
        sVar11 = local_438[0]._M_string_length;
        if ((9 < paVar17->mNumProperties) && (local_438[0]._M_string_length != 0)) {
          uVar3 = *(undefined4 *)(local_610 + 0x4c);
          uVar4 = *(undefined4 *)(local_610 + 0x50);
          uVar5 = *(undefined4 *)(local_610 + 0x54);
          if (local_438[0]._M_string_length < 0x400) {
            paVar18 = *ppaVar32;
            paVar18[9].length = (ai_uint32)local_438[0]._M_string_length;
            memcpy(paVar18[9].data,local_438[0]._M_dataplus._M_p,local_438[0]._M_string_length);
            paVar18[9].data[sVar11] = '\0';
          }
          paVar17->mValues[9].mType = AI_AIVECTOR3D;
          puVar21 = (undefined4 *)operator_new(0xc);
          *puVar21 = uVar3;
          puVar21[1] = uVar4;
          puVar21[2] = uVar5;
          paVar17->mValues[9].mData = puVar21;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438[0]._M_dataplus._M_p != paVar35) {
          operator_delete(local_438[0]._M_dataplus._M_p,
                          local_438[0].field_2._M_allocated_capacity + 1);
        }
        local_438[0]._M_dataplus._M_p = (pointer)paVar35;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"BBMin","");
        sVar11 = local_438[0]._M_string_length;
        if ((10 < paVar17->mNumProperties) && (local_438[0]._M_string_length != 0)) {
          uVar3 = *(undefined4 *)(local_610 + 0x60);
          uVar4 = *(undefined4 *)(local_610 + 100);
          uVar5 = *(undefined4 *)(local_610 + 0x68);
          if (local_438[0]._M_string_length < 0x400) {
            paVar18 = *ppaVar32;
            paVar18[10].length = (ai_uint32)local_438[0]._M_string_length;
            memcpy(paVar18[10].data,local_438[0]._M_dataplus._M_p,local_438[0]._M_string_length);
            paVar18[10].data[sVar11] = '\0';
          }
          paVar17->mValues[10].mType = AI_AIVECTOR3D;
          puVar21 = (undefined4 *)operator_new(0xc);
          *puVar21 = uVar3;
          puVar21[1] = uVar4;
          puVar21[2] = uVar5;
          paVar17->mValues[10].mData = puVar21;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438[0]._M_dataplus._M_p != paVar35) {
          operator_delete(local_438[0]._M_dataplus._M_p,
                          local_438[0].field_2._M_allocated_capacity + 1);
        }
        local_438[0]._M_dataplus._M_p = (pointer)paVar35;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"BBMax","");
        sVar11 = local_438[0]._M_string_length;
        if ((0xb < paVar17->mNumProperties) && (local_438[0]._M_string_length != 0)) {
          uVar3 = *(undefined4 *)(local_610 + 0x6c);
          uVar4 = *(undefined4 *)(local_610 + 0x70);
          uVar5 = *(undefined4 *)(local_610 + 0x74);
          if (local_438[0]._M_string_length < 0x400) {
            paVar18 = *ppaVar32;
            paVar18[0xb].length = (ai_uint32)local_438[0]._M_string_length;
            memcpy(paVar18[0xb].data,local_438[0]._M_dataplus._M_p,local_438[0]._M_string_length);
            paVar18[0xb].data[sVar11] = '\0';
          }
          paVar17->mValues[0xb].mType = AI_AIVECTOR3D;
          puVar21 = (undefined4 *)operator_new(0xc);
          *puVar21 = uVar3;
          puVar21[1] = uVar4;
          puVar21[2] = uVar5;
          paVar17->mValues[0xb].mData = puVar21;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438[0]._M_dataplus._M_p != paVar35) {
          operator_delete(local_438[0]._M_dataplus._M_p,
                          local_438[0].field_2._M_allocated_capacity + 1);
        }
        local_438[0]._M_dataplus._M_p = (pointer)paVar35;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"EntryNode","");
        sVar11 = local_438[0]._M_string_length;
        if ((0xc < paVar17->mNumProperties) && (local_438[0]._M_string_length != 0)) {
          if (local_438[0]._M_string_length < 0x400) {
            paVar18 = *ppaVar32;
            paVar18[0xc].length = (ai_uint32)local_438[0]._M_string_length;
            memcpy(paVar18[0xc].data,local_438[0]._M_dataplus._M_p,local_438[0]._M_string_length);
            paVar18[0xc].data[sVar11] = '\0';
          }
          paVar17->mValues[0xc].mType = AI_INT32;
          puVar21 = (undefined4 *)operator_new(4);
          *puVar21 = *(undefined4 *)(local_610 + 0xa0);
          paVar17->mValues[0xc].mData = puVar21;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438[0]._M_dataplus._M_p != paVar35) {
          operator_delete(local_438[0]._M_dataplus._M_p,
                          local_438[0].field_2._M_allocated_capacity + 1);
        }
        local_438[0]._M_dataplus._M_p = (pointer)paVar35;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"ExitNode","");
        sVar11 = local_438[0]._M_string_length;
        if ((0xd < paVar17->mNumProperties) && (local_438[0]._M_string_length != 0)) {
          if (local_438[0]._M_string_length < 0x400) {
            paVar18 = *ppaVar32;
            paVar18[0xd].length = (ai_uint32)local_438[0]._M_string_length;
            memcpy(paVar18[0xd].data,local_438[0]._M_dataplus._M_p,local_438[0]._M_string_length);
            paVar18[0xd].data[sVar11] = '\0';
          }
          paVar17->mValues[0xd].mType = AI_INT32;
          puVar21 = (undefined4 *)operator_new(4);
          *puVar21 = *(undefined4 *)(local_610 + 0xa4);
          paVar17->mValues[0xd].mData = puVar21;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438[0]._M_dataplus._M_p != paVar35) {
          operator_delete(local_438[0]._M_dataplus._M_p,
                          local_438[0].field_2._M_allocated_capacity + 1);
        }
        local_438[0]._M_dataplus._M_p = (pointer)paVar35;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"NodeFlags","");
        sVar11 = local_438[0]._M_string_length;
        if ((0xe < paVar17->mNumProperties) && (local_438[0]._M_string_length != 0)) {
          if (local_438[0]._M_string_length < 0x400) {
            paVar18 = *ppaVar32;
            paVar18[0xe].length = (ai_uint32)local_438[0]._M_string_length;
            memcpy(paVar18[0xe].data,local_438[0]._M_dataplus._M_p,local_438[0]._M_string_length);
            paVar18[0xe].data[sVar11] = '\0';
          }
          paVar17->mValues[0xe].mType = AI_INT32;
          puVar21 = (undefined4 *)operator_new(4);
          *puVar21 = *(undefined4 *)(local_610 + 0xa8);
          paVar17->mValues[0xe].mData = puVar21;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438[0]._M_dataplus._M_p != paVar35) {
          operator_delete(local_438[0]._M_dataplus._M_p,
                          local_438[0].field_2._M_allocated_capacity + 1);
        }
        local_438[0]._M_dataplus._M_p = (pointer)paVar35;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"Flags","");
        sVar11 = local_438[0]._M_string_length;
        if ((0xf < paVar17->mNumProperties) && (local_438[0]._M_string_length != 0)) {
          if (local_438[0]._M_string_length < 0x400) {
            paVar18 = *ppaVar32;
            paVar18[0xf].length = (ai_uint32)local_438[0]._M_string_length;
            memcpy(paVar18[0xf].data,local_438[0]._M_dataplus._M_p,local_438[0]._M_string_length);
            paVar18[0xf].data[sVar11] = '\0';
          }
          paVar17->mValues[0xf].mType = AI_INT32;
          puVar21 = (undefined4 *)operator_new(4);
          *puVar21 = *(undefined4 *)(local_610 + 0x24);
          paVar17->mValues[0xf].mData = puVar21;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438[0]._M_dataplus._M_p != paVar35) {
          operator_delete(local_438[0]._M_dataplus._M_p,
                          local_438[0].field_2._M_allocated_capacity + 1);
        }
        if ((*(HL1ImportSettings **)(local_5e8._16_8_ + 0x20))->read_blend_controllers == true) {
          bVar13 = get_num_blend_controllers(*(int *)(local_610 + 0x78),(int *)&local_5c8);
          puVar27 = local_5c8;
          uVar7 = (uint)local_5c8;
          if (bVar13 && (uint)local_5c8 != 0) {
            paVar15 = (aiNode *)operator_new(0x478);
            local_438[0]._M_dataplus._M_p = (pointer)paVar35;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_438,"BlendControllers","");
            aiNode::aiNode(paVar15,local_438);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_438[0]._M_dataplus._M_p != paVar35) {
              operator_delete(local_438[0]._M_dataplus._M_p,
                              local_438[0].field_2._M_allocated_capacity + 1);
            }
            local_5f8 = paVar15;
            if (iStack_5a0._M_current == local_598) {
              std::vector<aiNode*,std::allocator<aiNode*>>::_M_realloc_insert<aiNode*const&>
                        ((vector<aiNode*,std::allocator<aiNode*>> *)&local_5a8,iStack_5a0,&local_5f8
                        );
            }
            else {
              *iStack_5a0._M_current = paVar15;
              iStack_5a0._M_current = iStack_5a0._M_current + 1;
            }
            paVar15 = local_5f8;
            local_5f8->mParent = local_590;
            local_5f8->mNumChildren = uVar7;
            ppaVar16 = (aiNode **)operator_new__(((ulong)puVar27 & 0xffffffff) << 3);
            paVar15->mChildren = ppaVar16;
            if (local_5f8->mNumChildren != 0) {
              uVar29 = 0;
              do {
                paVar15 = (aiNode *)operator_new(0x478);
                aiNode::aiNode(paVar15);
                local_5f8->mChildren[uVar29] = paVar15;
                paVar15->mParent = local_5f8;
                paVar17 = (aiMetadata *)operator_new(0x18);
                paVar17->mKeys = (aiString *)0x0;
                paVar17->mValues = (aiMetadataEntry *)0x0;
                paVar17->mNumProperties = 3;
                paVar18 = (aiString *)operator_new__(0xc0c);
                ppaVar32 = &paVar17->mKeys;
                lVar34 = 5;
                do {
                  pcVar33 = paVar18->data + lVar34 + -9;
                  pcVar33[0] = '\0';
                  pcVar33[1] = '\0';
                  pcVar33[2] = '\0';
                  pcVar33[3] = '\0';
                  paVar18->data[lVar34 + -5] = '\0';
                  memset(paVar18->data + lVar34 + -4,0x1b,0x3ff);
                  lVar34 = lVar34 + 0x404;
                } while (lVar34 != 0xc11);
                paVar17->mKeys = paVar18;
                uVar31 = (ulong)paVar17->mNumProperties << 4;
                paVar19 = (aiMetadataEntry *)operator_new__(uVar31);
                memset(paVar19,0,uVar31);
                paVar17->mValues = paVar19;
                paVar15->mMetaData = paVar17;
                local_438[0]._M_dataplus._M_p = (pointer)&local_438[0].field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"Start","");
                sVar11 = local_438[0]._M_string_length;
                if ((paVar17->mNumProperties != 0) && (local_438[0]._M_string_length != 0)) {
                  if (local_438[0]._M_string_length < 0x400) {
                    paVar18 = *ppaVar32;
                    paVar18->length = (ai_uint32)local_438[0]._M_string_length;
                    memcpy(paVar18->data,local_438[0]._M_dataplus._M_p,local_438[0]._M_string_length
                          );
                    paVar18->data[sVar11] = '\0';
                  }
                  paVar17->mValues->mType = AI_FLOAT;
                  puVar21 = (undefined4 *)operator_new(4);
                  *puVar21 = *(undefined4 *)(local_610 + uVar29 * 4 + 0x88);
                  paVar17->mValues->mData = puVar21;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_438[0]._M_dataplus._M_p != &local_438[0].field_2) {
                  operator_delete(local_438[0]._M_dataplus._M_p,
                                  local_438[0].field_2._M_allocated_capacity + 1);
                }
                local_438[0]._M_dataplus._M_p = (pointer)&local_438[0].field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"End","");
                sVar11 = local_438[0]._M_string_length;
                if ((1 < paVar17->mNumProperties) && (local_438[0]._M_string_length != 0)) {
                  if (local_438[0]._M_string_length < 0x400) {
                    paVar18 = *ppaVar32;
                    paVar18[1].length = (ai_uint32)local_438[0]._M_string_length;
                    memcpy(paVar18[1].data,local_438[0]._M_dataplus._M_p,
                           local_438[0]._M_string_length);
                    paVar18[1].data[sVar11] = '\0';
                  }
                  paVar17->mValues[1].mType = AI_FLOAT;
                  puVar21 = (undefined4 *)operator_new(4);
                  *puVar21 = *(undefined4 *)(local_610 + uVar29 * 4 + 0x90);
                  paVar17->mValues[1].mData = puVar21;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_438[0]._M_dataplus._M_p != &local_438[0].field_2) {
                  operator_delete(local_438[0]._M_dataplus._M_p,
                                  local_438[0].field_2._M_allocated_capacity + 1);
                }
                local_438[0]._M_dataplus._M_p = (pointer)&local_438[0].field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_438,"MotionFlags","");
                sVar11 = local_438[0]._M_string_length;
                if ((2 < paVar17->mNumProperties) && (local_438[0]._M_string_length != 0)) {
                  if (local_438[0]._M_string_length < 0x400) {
                    paVar18 = *ppaVar32;
                    paVar18[2].length = (ai_uint32)local_438[0]._M_string_length;
                    memcpy(paVar18[2].data,local_438[0]._M_dataplus._M_p,
                           local_438[0]._M_string_length);
                    paVar18[2].data[sVar11] = '\0';
                  }
                  paVar17->mValues[2].mType = AI_INT32;
                  puVar21 = (undefined4 *)operator_new(4);
                  *puVar21 = *(undefined4 *)(local_610 + uVar29 * 4 + 0x80);
                  paVar17->mValues[2].mData = puVar21;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_438[0]._M_dataplus._M_p != &local_438[0].field_2) {
                  operator_delete(local_438[0]._M_dataplus._M_p,
                                  local_438[0].field_2._M_allocated_capacity + 1);
                }
                uVar29 = uVar29 + 1;
              } while (uVar29 < local_5f8->mNumChildren);
            }
          }
        }
        paVar35 = &local_438[0].field_2;
        if (((*(HL1ImportSettings **)(local_5e8._16_8_ + 0x20))->read_animation_events == true) &&
           (*(int *)(local_610 + 0x30) != 0)) {
          if (0x400 < *(int *)(local_610 + 0x30)) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_478,local_610,&local_5c9);
            plVar23 = (long *)std::__cxx11::string::replace((ulong)local_478,0,(char *)0x0,0x6e7933)
            ;
            local_4e0._M_dataplus._M_p = (pointer)&local_4e0.field_2;
            psVar26 = (size_type *)(plVar23 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar23 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar26) {
              local_4e0.field_2._M_allocated_capacity = *psVar26;
              local_4e0.field_2._8_4_ = *(undefined4 *)(plVar23 + 3);
              local_4e0.field_2._12_4_ = *(undefined4 *)((long)plVar23 + 0x1c);
            }
            else {
              local_4e0.field_2._M_allocated_capacity = *psVar26;
              local_4e0._M_dataplus._M_p = (pointer)*plVar23;
            }
            local_4e0._M_string_length = plVar23[1];
            *plVar23 = (long)psVar26;
            plVar23[1] = 0;
            *(undefined1 *)(plVar23 + 2) = 0;
            uVar7 = *(uint *)(local_610 + 0x30);
            local_4c0[0] = local_4b0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_4c0,"animation events","");
            this_00 = DefaultLogger::get();
            std::operator+(&local_458,"[Half-Life 1 MDL] ",&local_4e0);
            plVar23 = (long *)std::__cxx11::string::append((char *)&local_458);
            puVar27 = (ulong *)(plVar23 + 2);
            if ((ulong *)*plVar23 == puVar27) {
              local_510 = *puVar27;
              lStack_508 = plVar23[3];
              local_520 = &local_510;
            }
            else {
              local_510 = *puVar27;
              local_520 = (ulong *)*plVar23;
            }
            local_518 = plVar23[1];
            *plVar23 = (long)puVar27;
            plVar23[1] = 0;
            *(undefined1 *)(plVar23 + 2) = 0;
            __val = -uVar7;
            if (0 < (int)uVar7) {
              __val = uVar7;
            }
            __len = 1;
            if (9 < __val) {
              uVar29 = (ulong)__val;
              uVar12 = 4;
              do {
                __len = uVar12;
                uVar14 = (uint)uVar29;
                if (uVar14 < 100) {
                  __len = __len - 2;
                  goto LAB_0049299b;
                }
                if (uVar14 < 1000) {
                  __len = __len - 1;
                  goto LAB_0049299b;
                }
                if (uVar14 < 10000) goto LAB_0049299b;
                uVar29 = uVar29 / 10000;
                uVar12 = __len + 4;
              } while (99999 < uVar14);
              __len = __len + 1;
            }
LAB_0049299b:
            local_540 = local_530;
            std::__cxx11::string::_M_construct
                      ((ulong)&local_540,(char)__len - (char)((int)uVar7 >> 0x1f));
            std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)((ulong)(uVar7 >> 0x1f) + (long)local_540),__len,__val);
            uVar29 = 0xf;
            if (local_520 != &local_510) {
              uVar29 = local_510;
            }
            if (uVar29 < (ulong)(local_538 + local_518)) {
              uVar29 = 0xf;
              if (local_540 != local_530) {
                uVar29 = local_530[0];
              }
              if (uVar29 < (ulong)(local_538 + local_518)) goto LAB_00492a5c;
              puVar24 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&local_540,0,(char *)0x0,(ulong)local_520);
            }
            else {
LAB_00492a5c:
              puVar24 = (undefined8 *)
                        std::__cxx11::string::_M_append((char *)&local_520,(ulong)local_540);
            }
            plVar23 = puVar24 + 2;
            if ((long *)*puVar24 == plVar23) {
              local_4f0 = *plVar23;
              acStack_4e8 = (char  [8])puVar24[3];
              local_500 = &local_4f0;
            }
            else {
              local_4f0 = *plVar23;
              local_500 = (long *)*puVar24;
            }
            local_4f8 = (char  [8])puVar24[1];
            *puVar24 = plVar23;
            puVar24[1] = 0;
            *(undefined1 *)plVar23 = 0;
            plVar23 = (long *)std::__cxx11::string::append((char *)&local_500);
            plVar28 = plVar23 + 2;
            if ((long *)*plVar23 == plVar28) {
              local_490 = *plVar28;
              lStack_488 = plVar23[3];
              local_4a0 = &local_490;
            }
            else {
              local_490 = *plVar28;
              local_4a0 = (long *)*plVar23;
            }
            local_498 = plVar23[1];
            *plVar23 = (long)plVar28;
            plVar23[1] = 0;
            *(undefined1 *)(plVar23 + 2) = 0;
            plVar23 = (long *)std::__cxx11::string::_M_append
                                        ((char *)&local_4a0,(ulong)local_4c0[0]);
            paVar15 = (aiNode *)(plVar23 + 2);
            if ((aiNode *)*plVar23 == paVar15) {
              local_570._0_4_ = (paVar15->mName).length;
              local_570[4] = (paVar15->mName).data[0];
              local_570[5] = (paVar15->mName).data[1];
              local_570[6] = (paVar15->mName).data[2];
              local_570[7] = (paVar15->mName).data[3];
              local_570._8_8_ = plVar23[3];
              local_580 = (aiNode *)local_570;
            }
            else {
              local_570._0_4_ = (paVar15->mName).length;
              local_570[4] = (paVar15->mName).data[0];
              local_570[5] = (paVar15->mName).data[1];
              local_570[6] = (paVar15->mName).data[2];
              local_570[7] = (paVar15->mName).data[3];
              local_580 = (aiNode *)*plVar23;
            }
            local_578 = plVar23[1];
            *plVar23 = (long)paVar15;
            plVar23[1] = 0;
            *(undefined1 *)(plVar23 + 2) = 0;
            plVar23 = (long *)std::__cxx11::string::append((char *)&local_580);
            local_5c8 = &local_5b8;
            puVar27 = (ulong *)(plVar23 + 2);
            if ((ulong *)*plVar23 == puVar27) {
              local_5b8 = *puVar27;
              lStack_5b0 = plVar23[3];
            }
            else {
              local_5b8 = *puVar27;
              local_5c8 = (ulong *)*plVar23;
            }
            local_5c0 = plVar23[1];
            *plVar23 = (long)puVar27;
            plVar23[1] = 0;
            *(undefined1 *)(plVar23 + 2) = 0;
            local_560 = local_550;
            std::__cxx11::string::_M_construct((ulong)&local_560,'\x04');
            std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_560,4,0x400);
            uVar29 = 0xf;
            if (local_5c8 != &local_5b8) {
              uVar29 = local_5b8;
            }
            if (uVar29 < local_558 + local_5c0) {
              uVar29 = 0xf;
              if (local_560 != local_550) {
                uVar29 = local_550[0];
              }
              if (uVar29 < local_558 + local_5c0) goto LAB_00492c8e;
              plVar23 = (long *)std::__cxx11::string::replace
                                          ((ulong)&local_560,0,(char *)0x0,(ulong)local_5c8);
            }
            else {
LAB_00492c8e:
              plVar23 = (long *)std::__cxx11::string::_M_append((char *)&local_5c8,(ulong)local_560)
              ;
            }
            local_5f8 = (aiNode *)local_5e8;
            paVar15 = (aiNode *)(plVar23 + 2);
            if ((aiNode *)*plVar23 == paVar15) {
              local_5e8._0_4_ = (paVar15->mName).length;
              local_5e8[4] = (paVar15->mName).data[0];
              local_5e8[5] = (paVar15->mName).data[1];
              local_5e8[6] = (paVar15->mName).data[2];
              local_5e8[7] = (paVar15->mName).data[3];
              local_5e8._8_8_ = plVar23[3];
            }
            else {
              local_5e8._0_4_ = (paVar15->mName).length;
              local_5e8[4] = (paVar15->mName).data[0];
              local_5e8[5] = (paVar15->mName).data[1];
              local_5e8[6] = (paVar15->mName).data[2];
              local_5e8[7] = (paVar15->mName).data[3];
              local_5f8 = (aiNode *)*plVar23;
            }
            local_5f0 = plVar23[1];
            *plVar23 = (long)paVar15;
            plVar23[1] = 0;
            *(undefined1 *)&(paVar15->mName).length = 0;
            plVar23 = (long *)std::__cxx11::string::append((char *)&local_5f8);
            psVar26 = (size_type *)(plVar23 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar23 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar26) {
              local_438[0].field_2._0_8_ = *psVar26;
              local_438[0].field_2._8_8_ = plVar23[3];
              local_438[0]._M_dataplus._M_p = (pointer)paVar35;
            }
            else {
              local_438[0].field_2._0_8_ = *psVar26;
              local_438[0]._M_dataplus._M_p = (pointer)*plVar23;
            }
            local_438[0]._M_string_length = plVar23[1];
            *plVar23 = (long)psVar26;
            plVar23[1] = 0;
            *(undefined1 *)(plVar23 + 2) = 0;
            Logger::warn(this_00,local_438[0]._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_438[0]._M_dataplus._M_p != paVar35) {
              operator_delete(local_438[0]._M_dataplus._M_p,
                              local_438[0].field_2._M_allocated_capacity + 1);
            }
            if (local_5f8 != (aiNode *)local_5e8) {
              operator_delete(local_5f8,local_5e8._0_8_ + 1);
            }
            if (local_560 != local_550) {
              operator_delete(local_560,local_550[0] + 1);
            }
            if (local_5c8 != &local_5b8) {
              operator_delete(local_5c8,local_5b8 + 1);
            }
            if (local_580 != (aiNode *)local_570) {
              operator_delete(local_580,local_570._0_8_ + 1);
            }
            if (local_4a0 != &local_490) {
              operator_delete(local_4a0,local_490 + 1);
            }
            if (local_500 != &local_4f0) {
              operator_delete(local_500,local_4f0 + 1);
            }
            if (local_540 != local_530) {
              operator_delete(local_540,local_530[0] + 1);
            }
            if (local_520 != &local_510) {
              operator_delete(local_520,local_510 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_458._M_dataplus._M_p != &local_458.field_2) {
              operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_4c0[0] != local_4b0) {
              operator_delete(local_4c0[0],local_4b0[0] + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
              operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_478[0] != local_468) {
              operator_delete(local_478[0],local_468[0] + 1);
            }
          }
          pcVar33 = ((*(Header_HL1 **)(local_5e8._16_8_ + 0x28))->super_HalfLifeMDLBaseHeader).ident
                    + *(int *)(local_610 + 0x34);
          paVar15 = (aiNode *)operator_new(0x478);
          local_438[0]._M_dataplus._M_p = (pointer)paVar35;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"AnimationEvents","");
          aiNode::aiNode(paVar15,local_438);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_438[0]._M_dataplus._M_p != paVar35) {
            operator_delete(local_438[0]._M_dataplus._M_p,
                            local_438[0].field_2._M_allocated_capacity + 1);
          }
          local_580 = paVar15;
          if (iStack_5a0._M_current == local_598) {
            std::vector<aiNode*,std::allocator<aiNode*>>::_M_realloc_insert<aiNode*const&>
                      ((vector<aiNode*,std::allocator<aiNode*>> *)&local_5a8,iStack_5a0,&local_580);
          }
          else {
            *iStack_5a0._M_current = paVar15;
            iStack_5a0._M_current = iStack_5a0._M_current + 1;
          }
          paVar15 = local_580;
          local_580->mParent = local_590;
          uVar7 = *(uint *)(local_610 + 0x30);
          local_580->mNumChildren = uVar7;
          ppaVar16 = (aiNode **)operator_new__((ulong)uVar7 << 3);
          paVar15->mChildren = ppaVar16;
          if (local_580->mNumChildren != 0) {
            uVar29 = 0;
            do {
              paVar15 = (aiNode *)operator_new(0x478);
              aiNode::aiNode(paVar15);
              local_580->mChildren[uVar29] = paVar15;
              paVar15->mParent = local_580;
              paVar17 = (aiMetadata *)operator_new(0x18);
              paVar17->mKeys = (aiString *)0x0;
              paVar17->mValues = (aiMetadataEntry *)0x0;
              paVar17->mNumProperties = 3;
              paVar18 = (aiString *)operator_new__(0xc0c);
              ppaVar32 = &paVar17->mKeys;
              lVar34 = 5;
              do {
                pcVar2 = paVar18->data + lVar34 + -9;
                pcVar2[0] = '\0';
                pcVar2[1] = '\0';
                pcVar2[2] = '\0';
                pcVar2[3] = '\0';
                paVar18->data[lVar34 + -5] = '\0';
                memset(paVar18->data + lVar34 + -4,0x1b,0x3ff);
                lVar34 = lVar34 + 0x404;
              } while (lVar34 != 0xc11);
              paVar17->mKeys = paVar18;
              uVar31 = (ulong)paVar17->mNumProperties << 4;
              paVar19 = (aiMetadataEntry *)operator_new__(uVar31);
              memset(paVar19,0,uVar31);
              paVar17->mValues = paVar19;
              paVar15->mMetaData = paVar17;
              local_438[0]._M_dataplus._M_p = (pointer)&local_438[0].field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"Frame","");
              sVar11 = local_438[0]._M_string_length;
              if ((paVar17->mNumProperties != 0) && (local_438[0]._M_string_length != 0)) {
                if (local_438[0]._M_string_length < 0x400) {
                  paVar18 = *ppaVar32;
                  paVar18->length = (ai_uint32)local_438[0]._M_string_length;
                  memcpy(paVar18->data,local_438[0]._M_dataplus._M_p,local_438[0]._M_string_length);
                  paVar18->data[sVar11] = '\0';
                }
                paVar17->mValues->mType = AI_INT32;
                puVar21 = (undefined4 *)operator_new(4);
                *puVar21 = *(undefined4 *)pcVar33;
                paVar17->mValues->mData = puVar21;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_438[0]._M_dataplus._M_p != &local_438[0].field_2) {
                operator_delete(local_438[0]._M_dataplus._M_p,
                                local_438[0].field_2._M_allocated_capacity + 1);
              }
              local_438[0]._M_dataplus._M_p = (pointer)&local_438[0].field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"ScriptEvent","");
              sVar11 = local_438[0]._M_string_length;
              if ((1 < paVar17->mNumProperties) && (local_438[0]._M_string_length != 0)) {
                if (local_438[0]._M_string_length < 0x400) {
                  paVar18 = *ppaVar32;
                  paVar18[1].length = (ai_uint32)local_438[0]._M_string_length;
                  memcpy(paVar18[1].data,local_438[0]._M_dataplus._M_p,local_438[0]._M_string_length
                        );
                  paVar18[1].data[sVar11] = '\0';
                }
                paVar17->mValues[1].mType = AI_INT32;
                piVar25 = (int32_t *)operator_new(4);
                *piVar25 = *(int32_t *)(pcVar33 + 4);
                paVar17->mValues[1].mData = piVar25;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_438[0]._M_dataplus._M_p != &local_438[0].field_2) {
                operator_delete(local_438[0]._M_dataplus._M_p,
                                local_438[0].field_2._M_allocated_capacity + 1);
              }
              local_5f8 = (aiNode *)local_5e8;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f8,"Options","");
              local_5c8 = &local_5b8;
              sVar30 = strlen(pcVar33 + 0xc);
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_5c8,pcVar33 + 0xc,pcVar33 + sVar30 + 0xc);
              sVar30 = local_5c0 & 0xffffffff;
              if ((local_5c0 & 0xfffffc00) != 0) {
                sVar30 = 0x3ff;
              }
              local_438[0]._M_dataplus._M_p._0_4_ = (uint)sVar30;
              memcpy((void *)((long)&local_438[0]._M_dataplus._M_p + 4),local_5c8,sVar30);
              uVar31 = local_5f0;
              *(undefined1 *)((long)&local_438[0]._M_dataplus._M_p + sVar30 + 4) = 0;
              if ((2 < paVar17->mNumProperties) && (local_5f0 != 0)) {
                if (local_5f0 < 0x400) {
                  paVar18 = *ppaVar32;
                  paVar18[2].length = (ai_uint32)local_5f0;
                  memcpy(paVar18[2].data,local_5f8,local_5f0);
                  paVar18[2].data[uVar31] = '\0';
                }
                paVar17->mValues[2].mType = AI_AISTRING;
                puVar21 = (undefined4 *)operator_new(0x404);
                if (0x3fe < (uint)sVar30) {
                  sVar30 = 0x3ff;
                }
                *puVar21 = (int)sVar30;
                memcpy(puVar21 + 1,(void *)((long)&local_438[0]._M_dataplus._M_p + 4),sVar30);
                *(undefined1 *)((long)puVar21 + sVar30 + 4) = 0;
                paVar17->mValues[2].mData = puVar21;
              }
              if (local_5c8 != &local_5b8) {
                operator_delete(local_5c8,local_5b8 + 1);
              }
              if (local_5f8 != (aiNode *)local_5e8) {
                operator_delete(local_5f8,local_5e8._0_8_ + 1);
              }
              uVar29 = uVar29 + 1;
              pcVar33 = pcVar33 + 0x4c;
            } while (uVar29 < local_580->mNumChildren);
          }
        }
        if ((long)iStack_5a0._M_current - (long)local_5a8 != 0) {
          aiNode::addChildren(local_590,
                              (uint)((ulong)((long)iStack_5a0._M_current - (long)local_5a8) >> 3),
                              local_5a8);
        }
        lVar34 = local_480 + 1;
        local_610 = local_610 + 0xb0;
      } while (lVar34 < (*(Header_HL1 **)(local_5e8._16_8_ + 0x28))->numseq);
    }
    if (local_5a8 != (aiNode **)0x0) {
      operator_delete(local_5a8,(long)local_598 - (long)local_5a8);
    }
  }
  return;
}

Assistant:

void HL1MDLLoader::read_sequence_infos() {
    if (!header_->numseq)
        return;

    const SequenceDesc_HL1 *pseqdesc = (const SequenceDesc_HL1 *)((uint8_t *)header_ + header_->seqindex);

    aiNode *sequence_infos_node = new aiNode(AI_MDL_HL1_NODE_SEQUENCE_INFOS);
    rootnode_children_.push_back(sequence_infos_node);

    sequence_infos_node->mNumChildren = static_cast<unsigned int>(header_->numseq);
    sequence_infos_node->mChildren = new aiNode *[sequence_infos_node->mNumChildren];

    std::vector<aiNode *> sequence_info_node_children;

    int animation_index = 0;
    for (int i = 0; i < header_->numseq; ++i, ++pseqdesc) {
        // Clear the list of children for the upcoming sequence info node.
        sequence_info_node_children.clear();

        aiNode *sequence_info_node = sequence_infos_node->mChildren[i] = new aiNode(unique_sequence_names_[i]);
        sequence_info_node->mParent = sequence_infos_node;

        // Setup sequence info node Metadata.
        aiMetadata *md = sequence_info_node->mMetaData = aiMetadata::Alloc(16);
        md->Set(0, "AnimationIndex", animation_index);
        animation_index += pseqdesc->numblends;

        // Reference the sequence group by name. This allows us to search a particular
        // sequence group by name using aiNode(s).
        md->Set(1, "SequenceGroup", aiString(unique_sequence_groups_names_[pseqdesc->seqgroup]));
        md->Set(2, "FramesPerSecond", pseqdesc->fps);
        md->Set(3, "NumFrames", pseqdesc->numframes);
        md->Set(4, "NumBlends", pseqdesc->numblends);
        md->Set(5, "Activity", pseqdesc->activity);
        md->Set(6, "ActivityWeight", pseqdesc->actweight);
        md->Set(7, "MotionFlags", pseqdesc->motiontype);
        md->Set(8, "MotionBone", temp_bones_[pseqdesc->motionbone].node->mName);
        md->Set(9, "LinearMovement", aiVector3D(pseqdesc->linearmovement[0], pseqdesc->linearmovement[1], pseqdesc->linearmovement[2]));
        md->Set(10, "BBMin", aiVector3D(pseqdesc->bbmin[0], pseqdesc->bbmin[1], pseqdesc->bbmin[2]));
        md->Set(11, "BBMax", aiVector3D(pseqdesc->bbmax[0], pseqdesc->bbmax[1], pseqdesc->bbmax[2]));
        md->Set(12, "EntryNode", pseqdesc->entrynode);
        md->Set(13, "ExitNode", pseqdesc->exitnode);
        md->Set(14, "NodeFlags", pseqdesc->nodeflags);
        md->Set(15, "Flags", pseqdesc->flags);

        if (import_settings_.read_blend_controllers) {
            int num_blend_controllers;
            if (get_num_blend_controllers(pseqdesc->numblends, num_blend_controllers) && num_blend_controllers) {
                // Read blend controllers info.
                aiNode *blend_controllers_node = new aiNode(AI_MDL_HL1_NODE_BLEND_CONTROLLERS);
                sequence_info_node_children.push_back(blend_controllers_node);
                blend_controllers_node->mParent = sequence_info_node;
                blend_controllers_node->mNumChildren = static_cast<unsigned int>(num_blend_controllers);
                blend_controllers_node->mChildren = new aiNode *[blend_controllers_node->mNumChildren];

                for (unsigned int j = 0; j < blend_controllers_node->mNumChildren; ++j) {
                    aiNode *blend_controller_node = blend_controllers_node->mChildren[j] = new aiNode();
                    blend_controller_node->mParent = blend_controllers_node;

                    aiMetadata *md = blend_controller_node->mMetaData = aiMetadata::Alloc(3);
                    md->Set(0, "Start", pseqdesc->blendstart[j]);
                    md->Set(1, "End", pseqdesc->blendend[j]);
                    md->Set(2, "MotionFlags", pseqdesc->blendtype[j]);
                }
            }
        }

        if (import_settings_.read_animation_events && pseqdesc->numevents) {
            // Read animation events.

            if (pseqdesc->numevents > AI_MDL_HL1_MAX_EVENTS) {
                log_warning_limit_exceeded<AI_MDL_HL1_MAX_EVENTS>(
                        "Sequence " + std::string(pseqdesc->label),
                        pseqdesc->numevents, "animation events");
            }

            const AnimEvent_HL1 *pevent = (const AnimEvent_HL1 *)((uint8_t *)header_ + pseqdesc->eventindex);

            aiNode *pEventsNode = new aiNode(AI_MDL_HL1_NODE_ANIMATION_EVENTS);
            sequence_info_node_children.push_back(pEventsNode);
            pEventsNode->mParent = sequence_info_node;
            pEventsNode->mNumChildren = static_cast<unsigned int>(pseqdesc->numevents);
            pEventsNode->mChildren = new aiNode *[pEventsNode->mNumChildren];

            for (unsigned int j = 0; j < pEventsNode->mNumChildren; ++j, ++pevent) {
                aiNode *pEvent = pEventsNode->mChildren[j] = new aiNode();
                pEvent->mParent = pEventsNode;

                aiMetadata *md = pEvent->mMetaData = aiMetadata::Alloc(3);
                md->Set(0, "Frame", pevent->frame);
                md->Set(1, "ScriptEvent", pevent->event);
                md->Set(2, "Options", aiString(pevent->options));
            }
        }

        if (sequence_info_node_children.size()) {
            sequence_info_node->addChildren(
                    static_cast<unsigned int>(sequence_info_node_children.size()),
                    sequence_info_node_children.data());
        }
    }
}